

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicKReach.cpp
# Opt level: O2

void __thiscall
DynamicKReach::update_remove
          (DynamicKReach *this,vertex_t v,vector<unsigned_int,_std::allocator<unsigned_int>_> *out,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *dist)

{
  pointer puVar1;
  byte *pbVar2;
  reference pvVar3;
  
  pbVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,(ulong)v);
  if (this->k_ < *pbVar2) {
    return;
  }
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,(ulong)v);
  *pvVar3 = '?';
  puVar1 = (this->updated_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->updated_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->updated_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  collect_changes(this,out,dist);
  fix_changes(this,dist);
  return;
}

Assistant:

void DynamicKReach::update_remove(vertex_t v, const std::vector<vertex_t> &out, std::vector<distance_t> &dist) {
    if (dist.at(v) > k_) {
        return;
    }
    dist.at(v) = INF8;
    updated_.clear();
    collect_changes(out, dist);
    fix_changes(dist);
}